

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford.h
# Opt level: O0

void __thiscall
lemon::
BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
::~BellmanFord(BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
               *this)

{
  pointer pNVar1;
  vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_> *in_RDI;
  
  if ((((ulong)in_RDI[1].
               super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
               ._M_impl.super__Vector_impl_data._M_start & 1) != 0) &&
     (pNVar1 = (in_RDI->
               super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
               )._M_impl.super__Vector_impl_data._M_end_of_storage, pNVar1 != (pointer)0x0)) {
    (**(code **)(*(long *)pNVar1 + 8))();
  }
  if ((((ulong)in_RDI[1].
               super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) != 0) &&
     (pNVar1 = in_RDI[1].
               super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
               ._M_impl.super__Vector_impl_data._M_finish, pNVar1 != (pointer)0x0)) {
    (**(code **)(*(long *)pNVar1 + 8))();
  }
  if ((in_RDI[2].
       super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
       ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) &&
     (pNVar1 = in_RDI[2].
               super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
               ._M_impl.super__Vector_impl_data._M_start, pNVar1 != (pointer)0x0)) {
    (**(code **)(*(long *)pNVar1 + 8))();
  }
  std::vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>::
  ~vector(in_RDI);
  return;
}

Assistant:

~BellmanFord() {
    if (_local_pred)
      delete _pred;
    if (_local_dist)
      delete _dist;
    if (_mask)
      delete _mask;
  }